

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::appendFormat_va
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,C *formatString,axl_va_list *va
          )

{
  size_t sVar1;
  size_t sVar2;
  C *pCVar3;
  size_t length;
  axl_va_list local_78;
  axl_va_list local_58;
  
  local_78._0_8_ = *(undefined8 *)va;
  local_78._8_8_ = *(undefined8 *)&va->field_0x8;
  local_78._16_8_ = *(undefined8 *)&va->field_0x10;
  local_78.m_isInitialized = true;
  sVar2 = StringDetailsBase<char>::calcFormatLength_va(formatString,&local_78);
  if (local_78.m_isInitialized == true) {
    local_78.m_isInitialized = false;
  }
  sVar1 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  length = sVar1 + sVar2;
  pCVar3 = createBuffer(this,length,true);
  if (pCVar3 == (C *)0x0) {
    length = 0xffffffffffffffff;
  }
  else {
    local_58._0_8_ = *(undefined8 *)va;
    local_58._8_8_ = *(undefined8 *)&va->field_0x8;
    local_58._16_8_ = *(undefined8 *)&va->field_0x10;
    local_58.m_isInitialized = true;
    StringDetailsBase<char>::format_va
              ((this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p + sVar1,
               sVar2 + 1,formatString,&local_58);
  }
  return length;
}

Assistant:

size_t
	appendFormat_va(
		const C* formatString,
		axl_va_list va
	) {
		size_t appendLength = Details::calcFormatLength_va(formatString, va);
		size_t oldLength = this->m_length;
		size_t newLength = oldLength + appendLength;
		if (!createBuffer(newLength, true))
			return -1;

		Details::format_va(this->m_p + oldLength, appendLength + 1, formatString, va);
		return newLength;
	}